

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O2

string * __thiscall
re2::Prefilter::DebugString_abi_cxx11_(string *__return_storage_ptr__,Prefilter *this)

{
  pointer ppPVar1;
  ostream *this_00;
  string *s;
  char *pcVar2;
  size_t i;
  ulong uVar3;
  allocator local_1b1;
  LogMessage local_1b0;
  
  switch(this->op_) {
  case ALL:
    pcVar2 = "";
    goto LAB_001223be;
  case NONE:
    pcVar2 = "*no-matches*";
LAB_001223be:
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&local_1b0);
    break;
  case ATOM:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->atom_);
    break;
  case AND:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_1b0);
    for (uVar3 = 0;
        ppPVar1 = (this->subs_->
                  super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->subs_->
                              super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3);
        uVar3 = uVar3 + 1) {
      if (uVar3 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        ppPVar1 = (this->subs_->
                  super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      if (ppPVar1[uVar3] == (Prefilter *)0x0) {
        std::__cxx11::string::string((string *)&local_1b0,"<nil>",&local_1b1);
      }
      else {
        DebugString_abi_cxx11_((string *)&local_1b0,ppPVar1[uVar3]);
      }
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    break;
  case OR:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"(",(allocator *)&local_1b0);
    for (uVar3 = 0;
        ppPVar1 = (this->subs_->
                  super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->subs_->
                              super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3);
        uVar3 = uVar3 + 1) {
      if (uVar3 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        ppPVar1 = (this->subs_->
                  super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      if (ppPVar1[uVar3] == (Prefilter *)0x0) {
        std::__cxx11::string::string((string *)&local_1b0,"<nil>",&local_1b1);
      }
      else {
        DebugString_abi_cxx11_((string *)&local_1b0,ppPVar1[uVar3]);
      }
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  default:
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter.cc"
               ,0x29a);
    this_00 = std::operator<<((ostream *)&local_1b0.str_,"Bad op in Prefilter::DebugString: ");
    std::ostream::operator<<(this_00,this->op_);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Prefilter::DebugString() const {
  switch (op_) {
    default:
      LOG(DFATAL) << "Bad op in Prefilter::DebugString: " << op_;
      return StringPrintf("op%d", op_);
    case NONE:
      return "*no-matches*";
    case ATOM:
      return atom_;
    case ALL:
      return "";
    case AND: {
      std::string s = "";
      for (size_t i = 0; i < subs_->size(); i++) {
        if (i > 0)
          s += " ";
        Prefilter* sub = (*subs_)[i];
        s += sub ? sub->DebugString() : "<nil>";
      }
      return s;
    }
    case OR: {
      std::string s = "(";
      for (size_t i = 0; i < subs_->size(); i++) {
        if (i > 0)
          s += "|";
        Prefilter* sub = (*subs_)[i];
        s += sub ? sub->DebugString() : "<nil>";
      }
      s += ")";
      return s;
    }
  }
}